

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilCanon.c
# Opt level: O2

void Map_Var3Test(void)

{
  uint uVar1;
  uint uTruth;
  char *pfRes;
  uint *ptRes;
  char *pCounters;
  char **uPhases;
  uint *uCanons;
  
  Extra_Truth3VarN(&uCanons,&uPhases,&pCounters);
  for (uVar1 = 0; uVar1 != 0x100; uVar1 = uVar1 + 1) {
    uTruth = uVar1;
    Extra_TruthCanonN_rec(3,(uchar *)&uTruth,&ptRes,&pfRes,0);
  }
  return;
}

Assistant:

void Map_Var3Test()
{
    extern void Extra_Truth3VarN( unsigned ** puCanons, char *** puPhases, char ** ppCounters );

    unsigned * uCanons;
    char ** uPhases;
    char * pCounters;
    int i;
    unsigned * ptRes;
    char * pfRes;
    unsigned uTruth;
    int Count;

    Extra_Truth3VarN( &uCanons, &uPhases, &pCounters );

    for ( i = 0; i < 256; i++ )
    {
        uTruth = i;
        Count =  Extra_TruthCanonFastN( 5, 3, &uTruth, &ptRes, &pfRes );
    }
}